

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderBuiltinVarTests::init(ShaderBuiltinVarTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  ShaderBuiltinConstantCase *pSVar2;
  char *pcVar3;
  ShaderDepthRangeTest *pSVar4;
  VertexIDCase *this_00;
  TestNode *pTVar5;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  GetConstantValueFunc local_30;
  GetConstantValueFunc getValue;
  char *varName;
  char *caseName;
  ShaderBuiltinVarTests *pSStack_10;
  int ndx;
  ShaderBuiltinVarTests *this_local;
  
  pSStack_10 = this;
  for (caseName._4_4_ = 0; caseName._4_4_ < 0xb; caseName._4_4_ = caseName._4_4_ + 1) {
    varName = init::builtinConstants[caseName._4_4_].caseName;
    getValue = (GetConstantValueFunc)init::builtinConstants[caseName._4_4_].varName;
    local_30 = init::builtinConstants[caseName._4_4_].getValue;
    pSVar2 = (ShaderBuiltinConstantCase *)operator_new(0xa8);
    pcVar3 = varName;
    local_85 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar3,&local_71);
    std::operator+(&local_50,&local_70,"_vertex");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
              (pSVar2,pCVar1,pcVar3,(char *)getValue,(char *)getValue,local_30,SHADERTYPE_VERTEX);
    local_85 = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pSVar2 = (ShaderBuiltinConstantCase *)operator_new(0xa8);
    pcVar3 = varName;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar3,&local_c9);
    std::operator+(&local_a8,&local_c8,"_fragment");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
              (pSVar2,pCVar1,pcVar3,(char *)getValue,(char *)getValue,local_30,SHADERTYPE_FRAGMENT);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  pSVar4 = (ShaderDepthRangeTest *)operator_new(0x150);
  ShaderDepthRangeTest::ShaderDepthRangeTest
            (pSVar4,(this->super_TestCaseGroup).m_context,"depth_range_vertex","gl_DepthRange",true)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar4 = (ShaderDepthRangeTest *)operator_new(0x150);
  ShaderDepthRangeTest::ShaderDepthRangeTest
            (pSVar4,(this->super_TestCaseGroup).m_context,"depth_range_fragment","gl_DepthRange",
             false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  this_00 = (VertexIDCase *)operator_new(200);
  VertexIDCase::VertexIDCase(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar5 = (TestNode *)operator_new(0x78);
  FragCoordXYZCase::FragCoordXYZCase
            ((FragCoordXYZCase *)pTVar5,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x78);
  FragCoordWCase::FragCoordWCase((FragCoordWCase *)pTVar5,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x78);
  PointCoordCase::PointCoordCase((PointCoordCase *)pTVar5,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x78);
  FrontFacingCase::FrontFacingCase((FrontFacingCase *)pTVar5,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  return extraout_EAX;
}

Assistant:

void ShaderBuiltinVarTests::init (void)
{
	// Builtin constants.

	static const struct
	{
		const char*											caseName;
		const char*											varName;
		ShaderBuiltinConstantCase::GetConstantValueFunc		getValue;
	} builtinConstants[] =
	{
		// GLES 2.

		{ "max_vertex_attribs",					"gl_MaxVertexAttribs",				getInteger<GL_MAX_VERTEX_ATTRIBS>						},
		{ "max_vertex_uniform_vectors",			"gl_MaxVertexUniformVectors",		getInteger<GL_MAX_VERTEX_UNIFORM_VECTORS>				},
		{ "max_fragment_uniform_vectors",		"gl_MaxFragmentUniformVectors",		getInteger<GL_MAX_FRAGMENT_UNIFORM_VECTORS>				},
		{ "max_texture_image_units",			"gl_MaxTextureImageUnits",			getInteger<GL_MAX_TEXTURE_IMAGE_UNITS>					},
		{ "max_vertex_texture_image_units",		"gl_MaxVertexTextureImageUnits",	getInteger<GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS>			},
		{ "max_combined_texture_image_units",	"gl_MaxCombinedTextureImageUnits",	getInteger<GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS>			},
		{ "max_draw_buffers",					"gl_MaxDrawBuffers",				getInteger<GL_MAX_DRAW_BUFFERS>							},

		// GLES 3.

		{ "max_vertex_output_vectors",			"gl_MaxVertexOutputVectors",		getVectorsFromComps<GL_MAX_VERTEX_OUTPUT_COMPONENTS>	},
		{ "max_fragment_input_vectors",			"gl_MaxFragmentInputVectors",		getVectorsFromComps<GL_MAX_FRAGMENT_INPUT_COMPONENTS>	},
		{ "min_program_texel_offset",			"gl_MinProgramTexelOffset",			getInteger<GL_MIN_PROGRAM_TEXEL_OFFSET>					},
		{ "max_program_texel_offset",			"gl_MaxProgramTexelOffset",			getInteger<GL_MAX_PROGRAM_TEXEL_OFFSET>					}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(builtinConstants); ndx++)
	{
		const char* const										caseName	= builtinConstants[ndx].caseName;
		const char* const										varName		= builtinConstants[ndx].varName;
		const ShaderBuiltinConstantCase::GetConstantValueFunc	getValue	= builtinConstants[ndx].getValue;

		addChild(new ShaderBuiltinConstantCase(m_context, (string(caseName) + "_vertex").c_str(),	varName, varName, getValue, glu::SHADERTYPE_VERTEX));
		addChild(new ShaderBuiltinConstantCase(m_context, (string(caseName) + "_fragment").c_str(),	varName, varName, getValue, glu::SHADERTYPE_FRAGMENT));
	}

	addChild(new ShaderDepthRangeTest(m_context, "depth_range_vertex",		"gl_DepthRange", true));
	addChild(new ShaderDepthRangeTest(m_context, "depth_range_fragment",	"gl_DepthRange", false));

	// Vertex shader builtin variables.
	addChild(new VertexIDCase		(m_context));
	// \todo [2013-03-20 pyry] gl_InstanceID -- tested in instancing tests quite thoroughly.

	// Fragment shader builtin variables.

	addChild(new FragCoordXYZCase	(m_context));
	addChild(new FragCoordWCase		(m_context));
	addChild(new PointCoordCase		(m_context));
	addChild(new FrontFacingCase	(m_context));
}